

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O0

void __thiscall BaseNode::DeleteConnection(BaseNode *this,Connection *connection)

{
  iterator this_00;
  bool bVar1;
  reference other;
  const_iterator local_30;
  __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_> local_28;
  __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_> local_20;
  iterator it;
  Connection *connection_local;
  BaseNode *this_local;
  
  it._M_current = connection;
  local_20._M_current =
       (Connection *)std::vector<Connection,_std::allocator<Connection>_>::begin(&this->connections)
  ;
  while( true ) {
    local_28._M_current =
         (Connection *)std::vector<Connection,_std::allocator<Connection>_>::end(&this->connections)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    this_00 = it;
    if (!bVar1) {
      return;
    }
    other = __gnu_cxx::
            __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>::
            operator*(&local_20);
    bVar1 = Connection::operator==(this_00._M_current,other);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>::
    operator++(&local_20);
  }
  __gnu_cxx::__normal_iterator<Connection_const*,std::vector<Connection,std::allocator<Connection>>>
  ::__normal_iterator<Connection*>
            ((__normal_iterator<Connection_const*,std::vector<Connection,std::allocator<Connection>>>
              *)&local_30,&local_20);
  std::vector<Connection,_std::allocator<Connection>_>::erase(&this->connections,local_30);
  return;
}

Assistant:

void DeleteConnection(const Connection& connection)
    {
        for (auto it = connections.begin(); it != connections.end(); ++it)
        {
            if (connection == *it)
            {
                connections.erase(it);
                break;
            }
        }
    }